

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetFourZeroCrossingIntervals
               (double *filtered_signal,int y_length,double actual_fs,ZeroCrossings *zero_crossings)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  ulong uVar10;
  void *pvVar11;
  undefined8 *in_RDX;
  int in_ESI;
  long in_RDI;
  int i_2;
  int i_1;
  int i;
  int maximum_number;
  undefined4 in_stack_00000028;
  double in_stack_00000038;
  int in_stack_00000044;
  double *in_stack_00000048;
  int local_30;
  int local_2c;
  int local_28;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_ESI;
  uVar10 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  *in_RDX = pvVar11;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_ESI;
  uVar10 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  in_RDX[3] = pvVar11;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)in_ESI;
  uVar10 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  in_RDX[6] = pvVar11;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)in_ESI;
  uVar10 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  in_RDX[9] = pvVar11;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)in_ESI;
  uVar10 = SUB168(auVar5 * ZEXT816(8),0);
  if (SUB168(auVar5 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  in_RDX[1] = pvVar11;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)in_ESI;
  uVar10 = SUB168(auVar6 * ZEXT816(8),0);
  if (SUB168(auVar6 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  in_RDX[4] = pvVar11;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)in_ESI;
  uVar10 = SUB168(auVar7 * ZEXT816(8),0);
  if (SUB168(auVar7 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  in_RDX[7] = pvVar11;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = (long)in_ESI;
  uVar10 = SUB168(auVar8 * ZEXT816(8),0);
  if (SUB168(auVar8 * ZEXT816(8),8) != 0) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar11 = operator_new__(uVar10);
  in_RDX[10] = pvVar11;
  iVar9 = ZeroCrossingEngine(in_stack_00000048,in_stack_00000044,in_stack_00000038,filtered_signal,
                             (double *)CONCAT44(y_length,in_stack_00000028));
  *(int *)(in_RDX + 2) = iVar9;
  for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
    *(ulong *)(in_RDI + (long)local_28 * 8) =
         *(ulong *)(in_RDI + (long)local_28 * 8) ^ 0x8000000000000000;
  }
  iVar9 = ZeroCrossingEngine(in_stack_00000048,in_stack_00000044,in_stack_00000038,filtered_signal,
                             (double *)CONCAT44(y_length,in_stack_00000028));
  *(int *)(in_RDX + 5) = iVar9;
  for (local_2c = 0; local_2c < in_ESI + -1; local_2c = local_2c + 1) {
    *(double *)(in_RDI + (long)local_2c * 8) =
         *(double *)(in_RDI + (long)local_2c * 8) - *(double *)(in_RDI + (long)(local_2c + 1) * 8);
  }
  iVar9 = ZeroCrossingEngine(in_stack_00000048,in_stack_00000044,in_stack_00000038,filtered_signal,
                             (double *)CONCAT44(y_length,in_stack_00000028));
  *(int *)(in_RDX + 8) = iVar9;
  for (local_30 = 0; local_30 < in_ESI + -1; local_30 = local_30 + 1) {
    *(ulong *)(in_RDI + (long)local_30 * 8) =
         *(ulong *)(in_RDI + (long)local_30 * 8) ^ 0x8000000000000000;
  }
  iVar9 = ZeroCrossingEngine(in_stack_00000048,in_stack_00000044,in_stack_00000038,filtered_signal,
                             (double *)CONCAT44(y_length,in_stack_00000028));
  *(int *)(in_RDX + 0xb) = iVar9;
  return;
}

Assistant:

static void GetFourZeroCrossingIntervals(double *filtered_signal, int y_length,
    double actual_fs, ZeroCrossings *zero_crossings) {
  // x_length / 4 (old version) is fixed at 2013/07/14
  const int kMaximumNumber = y_length;
  zero_crossings->negative_interval_locations = new double[kMaximumNumber];
  zero_crossings->positive_interval_locations = new double[kMaximumNumber];
  zero_crossings->peak_interval_locations = new double[kMaximumNumber];
  zero_crossings->dip_interval_locations = new double[kMaximumNumber];
  zero_crossings->negative_intervals = new double[kMaximumNumber];
  zero_crossings->positive_intervals = new double[kMaximumNumber];
  zero_crossings->peak_intervals = new double[kMaximumNumber];
  zero_crossings->dip_intervals = new double[kMaximumNumber];
#if 1
  memset(zero_crossings->negative_interval_locations, 0, sizeof(double) * kMaximumNumber);
  memset(zero_crossings->positive_interval_locations, 0, sizeof(double) * kMaximumNumber);
  memset(zero_crossings->peak_interval_locations, 0, sizeof(double) * kMaximumNumber);
  memset(zero_crossings->dip_interval_locations, 0, sizeof(double) * kMaximumNumber);
  memset(zero_crossings->negative_intervals, 0, sizeof(double) * kMaximumNumber);
  memset(zero_crossings->positive_intervals, 0, sizeof(double) * kMaximumNumber);
  memset(zero_crossings->peak_intervals, 0, sizeof(double) * kMaximumNumber);
  memset(zero_crossings->dip_intervals, 0, sizeof(double) * kMaximumNumber);
#endif

  zero_crossings->number_of_negatives = ZeroCrossingEngine(filtered_signal,
      y_length, actual_fs, zero_crossings->negative_interval_locations,
      zero_crossings->negative_intervals);

  for (int i = 0; i < y_length; ++i) filtered_signal[i] = -filtered_signal[i];
  zero_crossings->number_of_positives = ZeroCrossingEngine(filtered_signal,
      y_length, actual_fs, zero_crossings->positive_interval_locations,
      zero_crossings->positive_intervals);

  for (int i = 0; i < y_length - 1; ++i) filtered_signal[i] =
    filtered_signal[i] - filtered_signal[i + 1];
  zero_crossings->number_of_peaks = ZeroCrossingEngine(filtered_signal,
      y_length - 1, actual_fs, zero_crossings->peak_interval_locations,
      zero_crossings->peak_intervals);

  for (int i = 0; i < y_length - 1; ++i)
    filtered_signal[i] = -filtered_signal[i];
  zero_crossings->number_of_dips = ZeroCrossingEngine(filtered_signal,
      y_length - 1, actual_fs, zero_crossings->dip_interval_locations,
      zero_crossings->dip_intervals);
}